

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

bool ImGui::TableBeginContextMenuPopup(ImGuiTable *table)

{
  bool bVar1;
  ImGuiID id;
  
  if (table->IsContextPopupOpen != true) {
    return false;
  }
  if (table->InstanceCurrent == table->InstanceInteracted) {
    id = ImHashStr("##ContextMenu",0,table->ID);
    bVar1 = BeginPopupEx(id,0x141);
    if (bVar1) {
      return true;
    }
    table->IsContextPopupOpen = false;
  }
  return false;
}

Assistant:

bool ImGui::TableBeginContextMenuPopup(ImGuiTable* table)
{
    if (!table->IsContextPopupOpen || table->InstanceCurrent != table->InstanceInteracted)
        return false;
    const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
    if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        return true;
    table->IsContextPopupOpen = false;
    return false;
}